

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

int TIFFStartTile(TIFF *tif,uint32_t tile)

{
  int iVar1;
  uint64_t uVar2;
  uint local_34;
  uint local_30;
  uint32_t howmany32;
  TIFFDirectory *td;
  uint32_t tile_local;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x20) == 0) {
    iVar1 = (*tif->tif_setupdecode)(tif);
    if (iVar1 == 0) {
      return 0;
    }
    tif->tif_flags = tif->tif_flags | 0x20;
  }
  tif->tif_curtile = tile;
  if ((tif->tif_dir).td_imagewidth < -((tif->tif_dir).td_tilewidth - 1) - 1) {
    local_30 = ((tif->tif_dir).td_imagewidth + ((tif->tif_dir).td_tilewidth - 1)) /
               (tif->tif_dir).td_tilewidth;
  }
  else {
    local_30 = 0;
  }
  if (local_30 == 0) {
    TIFFErrorExtR(tif,"TIFFStartTile","Zero tiles");
    tif_local._4_4_ = 0;
  }
  else {
    tif->tif_row = (tile % local_30) * (tif->tif_dir).td_tilelength;
    if ((tif->tif_dir).td_imagelength < -((tif->tif_dir).td_tilelength - 1) - 1) {
      local_34 = ((tif->tif_dir).td_imagelength + ((tif->tif_dir).td_tilelength - 1)) /
                 (tif->tif_dir).td_tilelength;
    }
    else {
      local_34 = 0;
    }
    if (local_34 == 0) {
      TIFFErrorExtR(tif,"TIFFStartTile","Zero tiles");
      tif_local._4_4_ = 0;
    }
    else {
      tif->tif_col = (tile % local_34) * (tif->tif_dir).td_tilewidth;
      tif->tif_flags = tif->tif_flags & 0xffefffff;
      if ((tif->tif_flags & 0x20000) == 0) {
        tif->tif_rawcp = tif->tif_rawdata;
        if (tif->tif_rawdataloaded < 1) {
          uVar2 = TIFFGetStrileByteCount(tif,tile);
          tif->tif_rawcc = uVar2;
        }
        else {
          tif->tif_rawcc = tif->tif_rawdataloaded;
        }
      }
      else {
        tif->tif_rawcp = (uint8_t *)0x0;
        tif->tif_rawcc = 0;
      }
      tif_local._4_4_ =
           (*tif->tif_predecode)(tif,(uint16_t)(tile / (tif->tif_dir).td_stripsperimage));
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFStartTile(TIFF *tif, uint32_t tile)
{
    static const char module[] = "TIFFStartTile";
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t howmany32;

    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupdecode)(tif))
            return (0);
        tif->tif_flags |= TIFF_CODERSETUP;
    }
    tif->tif_curtile = tile;
    howmany32 = TIFFhowmany_32(td->td_imagewidth, td->td_tilewidth);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return 0;
    }
    tif->tif_row = (tile % howmany32) * td->td_tilelength;
    howmany32 = TIFFhowmany_32(td->td_imagelength, td->td_tilelength);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return 0;
    }
    tif->tif_col = (tile % howmany32) * td->td_tilewidth;
    tif->tif_flags &= ~TIFF_BUF4WRITE;
    if (tif->tif_flags & TIFF_NOREADRAW)
    {
        tif->tif_rawcp = NULL;
        tif->tif_rawcc = 0;
    }
    else
    {
        tif->tif_rawcp = tif->tif_rawdata;
        if (tif->tif_rawdataloaded > 0)
            tif->tif_rawcc = tif->tif_rawdataloaded;
        else
            tif->tif_rawcc = (tmsize_t)TIFFGetStrileByteCount(tif, tile);
    }
    return (
        (*tif->tif_predecode)(tif, (uint16_t)(tile / td->td_stripsperimage)));
}